

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O1

int arkResizeVectors(ARKodeMem ark_mem,ARKVecResizeFn resize,void *resize_data,sunindextype lrw_diff
                    ,sunindextype liw_diff,N_Vector tmpl)

{
  int iVar1;
  
  iVar1 = arkResizeVec(ark_mem,resize,resize_data,lrw_diff,liw_diff,tmpl,&ark_mem->Vabstol);
  if (((iVar1 != 0) &&
      (iVar1 = arkResizeVec(ark_mem,resize,resize_data,lrw_diff,liw_diff,tmpl,&ark_mem->VRabstol),
      iVar1 != 0)) &&
     (iVar1 = arkResizeVec(ark_mem,resize,resize_data,lrw_diff,liw_diff,tmpl,&ark_mem->ewt),
     iVar1 != 0)) {
    if (ark_mem->rwt_is_ewt == 0) {
      iVar1 = arkResizeVec(ark_mem,resize,resize_data,lrw_diff,liw_diff,tmpl,&ark_mem->rwt);
      if (iVar1 == 0) {
        return 0;
      }
    }
    else {
      ark_mem->rwt = ark_mem->ewt;
    }
    iVar1 = arkResizeVec(ark_mem,resize,resize_data,lrw_diff,liw_diff,tmpl,&ark_mem->yn);
    if ((((iVar1 != 0) &&
         (iVar1 = arkResizeVec(ark_mem,resize,resize_data,lrw_diff,liw_diff,tmpl,&ark_mem->fn),
         iVar1 != 0)) &&
        ((iVar1 = arkResizeVec(ark_mem,resize,resize_data,lrw_diff,liw_diff,tmpl,&ark_mem->tempv1),
         iVar1 != 0 &&
         ((iVar1 = arkResizeVec(ark_mem,resize,resize_data,lrw_diff,liw_diff,tmpl,&ark_mem->tempv2),
          iVar1 != 0 &&
          (iVar1 = arkResizeVec(ark_mem,resize,resize_data,lrw_diff,liw_diff,tmpl,&ark_mem->tempv3),
          iVar1 != 0)))))) &&
       (iVar1 = arkResizeVec(ark_mem,resize,resize_data,lrw_diff,liw_diff,tmpl,&ark_mem->tempv4),
       iVar1 != 0)) {
      iVar1 = arkResizeVec(ark_mem,resize,resize_data,lrw_diff,liw_diff,tmpl,&ark_mem->constraints);
      return iVar1;
    }
  }
  return 0;
}

Assistant:

booleantype arkResizeVectors(ARKodeMem ark_mem, ARKVecResizeFn resize,
                             void *resize_data, sunindextype lrw_diff,
                             sunindextype liw_diff, N_Vector tmpl)
{
  /* Vabstol */
  if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                    liw_diff, tmpl, &ark_mem->Vabstol))
    return(SUNFALSE);

  /* VRabstol */
  if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                    liw_diff, tmpl, &ark_mem->VRabstol))
    return(SUNFALSE);

  /* ewt */
  if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                    liw_diff, tmpl, &ark_mem->ewt))
    return(SUNFALSE);

  /* rwt  */
  if (ark_mem->rwt_is_ewt) {      /* update pointer to ewt */
    ark_mem->rwt = ark_mem->ewt;
  } else {                        /* resize if distinct from ewt */
    if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                      liw_diff, tmpl, &ark_mem->rwt))
      return(SUNFALSE);
  }

  /* yn */
  if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                    liw_diff, tmpl, &ark_mem->yn))
    return(SUNFALSE);

  /* fn */
  if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                    liw_diff, tmpl, &ark_mem->fn))
    return(SUNFALSE);

  /* tempv* */
  if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                    liw_diff, tmpl, &ark_mem->tempv1))
    return(SUNFALSE);

  if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                    liw_diff, tmpl, &ark_mem->tempv2))
    return(SUNFALSE);

  if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                    liw_diff, tmpl, &ark_mem->tempv3))
    return(SUNFALSE);

  if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                    liw_diff, tmpl, &ark_mem->tempv4))
    return(SUNFALSE);

  /* constraints */
  if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                    liw_diff, tmpl, &ark_mem->constraints))
    return(SUNFALSE);

  return(SUNTRUE);
}